

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O0

pair<unsigned_int,_const_char_*> parse_hex(char *src,int size)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int in_ESI;
  char *in_RDI;
  pair<unsigned_int,_const_char_*> pVar2;
  char c;
  uint32_t value;
  char *end;
  char *pos;
  char **in_stack_ffffffffffffff28;
  uint *in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff38;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff7c;
  string local_58 [35];
  char local_35;
  int local_34;
  char *local_30;
  char *local_28;
  
  local_30 = in_RDI + in_ESI;
  local_34 = 0;
  local_28 = in_RDI;
  while( true ) {
    uVar3 = false;
    if (local_28 < local_30) {
      uVar3 = *local_28 != '\0';
    }
    if ((bool)uVar3 == false) break;
    local_34 = local_34 * 0x10;
    local_35 = *local_28;
    if ((local_35 < 'a') || ('f' < local_35)) {
      if ((local_35 < 'A') || ('F' < local_35)) {
        if ((local_35 < '0') || ('9' < local_35)) break;
        iVar1 = local_35 + -0x30;
      }
      else {
        iVar1 = local_35 + -0x37;
      }
    }
    else {
      iVar1 = local_35 + -0x57;
    }
    local_34 = iVar1 + local_34;
    local_28 = local_28 + 1;
  }
  if (local_28 == local_30) {
    pVar2 = std::make_pair<unsigned_int&,char_const*&>
                      (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pVar2._4_4_ = 0;
    return pVar2;
  }
  uVar4 = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  std::__cxx11::to_string(in_stack_ffffffffffffff7c);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffff3c,
                                  CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffff38))),__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,
                          CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffff38))),(char *)__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,
                          CONCAT13(uVar4,CONCAT12(uVar3,in_stack_ffffffffffffff38))),(char *)__rhs);
  std::runtime_error::runtime_error((runtime_error *)__rhs,local_58);
  __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::pair<uint32_t, const char *> parse_hex(const char * src, int size) {
    const char * pos   = src;
    const char * end   = src + size;
    uint32_t     value = 0;
    for ( ; pos < end && *pos; pos++) {
        value <<= 4;
        char c = *pos;
        if ('a' <= c && c <= 'f') {
            value += c - 'a' + 10;
        } else if ('A' <= c && c <= 'F') {
            value += c - 'A' + 10;
        } else if ('0' <= c && c <= '9') {
            value += c - '0';
        } else {
            break;
        }
    }
    if (pos != end) {
        throw std::runtime_error("expecting " + std::to_string(size) + " hex chars at " + src);
    }
    return std::make_pair(value, pos);
}